

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.h
# Opt level: O0

TestResult *
JsonTest::checkEqual<float,float>
          (TestResult *result,float expected,float actual,char *file,uint line,char *expr)

{
  char *in_RCX;
  uint in_EDX;
  char *in_RSI;
  TestResult *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  char (*in_stack_00000178) [11];
  TestResult *in_stack_00000180;
  
  if ((in_XMM0_Da != in_XMM1_Da) || (NAN(in_XMM0_Da) || NAN(in_XMM1_Da))) {
    TestResult::addFailure((TestResult *)CONCAT44(in_XMM0_Da,in_XMM1_Da),in_RSI,in_EDX,in_RCX);
    TestResult::operator<<(in_stack_00000180,in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(float *)in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(char (*) [2])in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,in_stack_00000178);
    TestResult::operator<<(in_stack_00000180,(float *)in_stack_00000178);
  }
  return in_RDI;
}

Assistant:

TestResult& checkEqual(TestResult& result,
                       T expected,
                       U actual,
                       const char* file,
                       unsigned int line,
                       const char* expr) {
  if (static_cast<U>(expected) != actual) {
    result.addFailure(file, line, expr);
    result << "Expected: " << static_cast<U>(expected) << "\n";
    result << "Actual  : " << actual;
  }
  return result;
}